

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O0

void __thiscall bgui::ImageWindow::ImageWindow(ImageWindow *this)

{
  ImageWindow *in_RDI;
  int in_stack_000002e0;
  int in_stack_000002e4;
  char *in_stack_000002e8;
  BaseWindow *in_stack_000002f0;
  string *this_00;
  string local_28 [40];
  
  BaseWindow::BaseWindow(in_stack_000002f0,in_stack_000002e8,in_stack_000002e4,in_stack_000002e0);
  (in_RDI->super_BaseWindow)._vptr_BaseWindow = (_func_int **)&PTR__ImageWindow_00146708;
  this_00 = &in_RDI->helptext;
  std::__cxx11::string::string((string *)this_00);
  in_RDI->adapt = (ImageAdapterBase *)0x0;
  in_RDI->del = false;
  in_RDI->lastkey = '\0';
  in_RDI->imy = 0;
  in_RDI->imx = 0;
  in_RDI->yp = 0;
  in_RDI->xp = 0;
  in_RDI->showinfo = false;
  (anonymous_namespace)::createHelpText_abi_cxx11_();
  addHelpText(in_RDI,this_00);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

ImageWindow::ImageWindow() : BaseWindow("Image", 100, 100)
{
  adapt=0;
  del=false;
  lastkey='\0';
  imx=imy=0;
  xp=yp=0;
  showinfo=false;

  addHelpText(createHelpText());
}